

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<6UL>::SetConfigurable
          (SimpleTypeHandler<6UL> *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  ScriptContext *this_00;
  bool bVar1;
  PropertyIndex in_AX;
  BOOL BVar2;
  int iVar3;
  DynamicTypeHandler *pDVar4;
  uint uVar5;
  uint uVar6;
  uint32 local_38;
  uint local_34;
  uint32 indexVal;
  
  iVar3 = this->propertyCount;
  bVar1 = 0 < iVar3;
  if (0 < iVar3) {
    if ((this->descriptors[0].Id.ptr)->pid == propertyId) {
      bVar1 = true;
      in_AX = 0;
    }
    else {
      uVar6 = 1;
      do {
        in_AX = (PropertyIndex)uVar6;
        uVar5 = uVar6 & 0xffff;
        bVar1 = (int)uVar5 < iVar3;
        if (iVar3 <= (int)uVar5) break;
        uVar6 = uVar5 + 1;
      } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar5 << 4)) + 8) !=
               propertyId);
    }
  }
  if (bVar1) {
    if (value == 0) {
      ClearAttribute(this,instance,in_AX,'\x02');
    }
    else {
      SetAttribute(this,instance,in_AX,'\x02');
    }
    iVar3 = 1;
  }
  else {
    this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
    local_34 = value;
    bVar1 = DynamicObject::HasObjectArray(instance);
    iVar3 = 1;
    if ((bVar1) &&
       (BVar2 = ScriptContext::IsNumericPropertyId(this_00,propertyId,&local_38), BVar2 != 0)) {
      pDVar4 = ConvertToTypeWithItemAttributes(this,instance);
      iVar3 = (*pDVar4->_vptr_DynamicTypeHandler[0x2b])
                        (pDVar4,instance,(ulong)(uint)propertyId,(ulong)local_34);
    }
  }
  return iVar3;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetConfigurable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            ScriptContext* scriptContext = instance->GetScriptContext();
            uint32 indexVal;
            if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
            {
                return SimpleTypeHandler<size>::ConvertToTypeWithItemAttributes(instance)
                    ->SetConfigurable(instance, propertyId, value);
            }
            return true;
        }

        if (value)
        {
            SetAttribute(instance, index, PropertyConfigurable);
        }
        else
        {
            ClearAttribute(instance, index, PropertyConfigurable);
        }
        return true;
    }